

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_stream_test.c
# Opt level: O0

void test_tcp_dialer_loc_addr(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_sockaddr sa;
  nng_stream_dialer *d;
  
  nVar1 = nng_stream_dialer_alloc
                    ((nng_stream_dialer **)(sa.s_storage.sa_pad + 0xf),"tcp://127.0.0.1:80");
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x1b5,"%s: expected success, got %s (%d)",
                         "nng_stream_dialer_alloc(&d, \"tcp://127.0.0.1:80\")",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_stream_dialer_get_addr
                    ((nng_stream_dialer *)sa.s_storage.sa_pad[0xf],"local-address",
                     (nng_sockaddr *)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x1b6,"%s: expected success, got %s (%d)",
                         "nng_stream_dialer_get_addr(d, NNG_OPT_LOCADDR, &sa)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)((undefined2)result__1 == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x1b7,"%s","sa.s_family == NNG_AF_UNSPEC");
  result__1._0_2_ = NNG_EINVAL;
  result__1._2_2_ = 0x1f90;
  num = nng_stream_dialer_set_addr
                  ((nng_stream_dialer *)sa.s_storage.sa_pad[0xf],"local-address",
                   (nng_sockaddr *)&result__1);
  pcVar3 = nng_strerror(NNG_EADDRINVAL);
  acutest_check_((uint)(num == NNG_EADDRINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x1bd,"%s fails with %s","nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)",
                 pcVar3,nVar1);
  pcVar3 = nng_strerror(NNG_EADDRINVAL);
  pcVar4 = nng_strerror(num);
  acutest_message_("%s: expected %s (%d), got %s (%d)",
                   "nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)",pcVar3,0xf,pcVar4,
                   (ulong)num);
  result__1._0_2_ = NNG_EBUSY;
  result__1._2_2_ = 0x1f90;
  nVar1 = nng_stream_dialer_set_addr
                    ((nng_stream_dialer *)sa.s_storage.sa_pad[0xf],"local-address",
                     (nng_sockaddr *)&result__1);
  pcVar3 = nng_strerror(NNG_EADDRINVAL);
  acutest_check_((uint)(nVar1 == NNG_EADDRINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x1c4,"%s fails with %s","nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)",
                 pcVar3);
  pcVar3 = nng_strerror(NNG_EADDRINVAL);
  pcVar4 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)",
                   "nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)",pcVar3,0xf,pcVar4,
                   (ulong)nVar1);
  result__1._0_2_ = NNG_EINTR;
  snprintf((char *)((long)&result__1 + 2),0x80,"junk");
  nVar1 = nng_stream_dialer_set_addr
                    ((nng_stream_dialer *)sa.s_storage.sa_pad[0xf],"local-address",
                     (nng_sockaddr *)&result__1);
  pcVar3 = nng_strerror(NNG_EADDRINVAL);
  acutest_check_((uint)(nVar1 == NNG_EADDRINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x1cb,"%s fails with %s","nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)",
                 pcVar3);
  pcVar3 = nng_strerror(NNG_EADDRINVAL);
  pcVar4 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)",
                   "nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)",pcVar3,0xf,pcVar4,
                   (ulong)nVar1);
  nVar1 = nng_stream_dialer_set_int
                    ((nng_stream_dialer *)sa.s_storage.sa_pad[0xf],"local-address",0x2a);
  pcVar3 = nng_strerror(NNG_EBADTYPE);
  acutest_check_((uint)(nVar1 == NNG_EBADTYPE),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x1cf,"%s fails with %s","nng_stream_dialer_set_int(d, NNG_OPT_LOCADDR, 42)",
                 pcVar3);
  pcVar3 = nng_strerror(NNG_EBADTYPE);
  pcVar4 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)",
                   "nng_stream_dialer_set_int(d, NNG_OPT_LOCADDR, 42)",pcVar3,0x1e,pcVar4,
                   (ulong)nVar1);
  result__1._0_2_ = NNG_EINVAL;
  result__1._2_2_ = NNG_OK >> 0x10;
  result_ = nuts_be32(0x7f000001);
  nVar1 = nng_stream_dialer_set_addr
                    ((nng_stream_dialer *)sa.s_storage.sa_pad[0xf],"local-address",
                     (nng_sockaddr *)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x1d5,"%s: expected success, got %s (%d)",
                         "nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_stream_dialer_free((nng_stream_dialer *)sa.s_storage.sa_pad[0xf]);
  return;
}

Assistant:

void
test_tcp_dialer_loc_addr(void)
{
	nng_stream_dialer *d;
	nng_sockaddr       sa;
	NUTS_PASS(nng_stream_dialer_alloc(&d, "tcp://127.0.0.1:80"));
	NUTS_PASS(nng_stream_dialer_get_addr(d, NNG_OPT_LOCADDR, &sa));
	NUTS_TRUE(sa.s_family == NNG_AF_UNSPEC);

	// cannot set a local port
	sa.s_in.sa_family = NNG_AF_INET;
	sa.s_in.sa_port   = 8080;
	NUTS_FAIL(nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa),
	    NNG_EADDRINVAL);

#ifdef NNG_HAVE_INET6
	// cannot set a local port
	sa.s_in6.sa_family = NNG_AF_INET6;
	sa.s_in6.sa_port   = 8080;
	NUTS_FAIL(nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa),
	    NNG_EADDRINVAL);
#endif

	// cannot set it to a bogus family
	sa.s_inproc.sa_family = NNG_AF_INPROC;
	snprintf(sa.s_inproc.sa_name, sizeof(sa.s_inproc.sa_name), "junk");
	NUTS_FAIL(nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa),
	    NNG_EADDRINVAL);

	// bad type test
	NUTS_FAIL(
	    nng_stream_dialer_set_int(d, NNG_OPT_LOCADDR, 42), NNG_EBADTYPE);

	// but we can set it to a legal value
	sa.s_in.sa_family = NNG_AF_INET;
	sa.s_in.sa_port   = 0;
	sa.s_in.sa_addr   = nuts_be32(0x7F000001);
	NUTS_PASS(nng_stream_dialer_set_addr(d, NNG_OPT_LOCADDR, &sa));

	nng_stream_dialer_free(d);
}